

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

AddMeshError xatlas::AddUvMesh(Atlas *atlas,UvMeshDecl *decl)

{
  void *pvVar1;
  void *pvVar2;
  uint32_t *puVar3;
  int32_t iVar4;
  IndexFormat IVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  int iVar9;
  UvMesh **ppUVar10;
  UvMesh *this;
  uint *puVar11;
  Vector2 *pVVar12;
  Vector2 *pVVar13;
  Vector2 *pVVar14;
  char *pcVar15;
  int extraout_EDX;
  int extraout_EDX_00;
  ulong extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar16;
  undefined8 extraout_RDX_01;
  uint32_t i;
  uint uVar17;
  uint uVar18;
  int iVar19;
  undefined *puVar20;
  AddMeshError AVar21;
  ulong uVar22;
  uint32_t m;
  uint32_t i_3;
  long lVar23;
  uint32_t i_1;
  uint32_t i_00;
  float fVar24;
  UvMesh *mesh;
  uint local_54;
  uint local_50;
  uint32_t tri [3];
  UvMeshInstance *meshInstance;
  
  if (atlas == (Atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                  ,0x2431,"AddMeshError xatlas::AddUvMesh(Atlas *, const UvMeshDecl &)");
  }
  if (atlas[3].chartCount == 0) {
    uVar17 = decl->vertexCount;
    pcVar15 = (char *)(ulong)uVar17;
    local_50 = decl->indexCount;
    uVar18 = local_50;
    if (local_50 == 0) {
      uVar18 = uVar17;
    }
    puVar20 = internal::s_print;
    if ((internal::s_print != (undefined *)0x0) && (internal::s_printVerbose == '\x01')) {
      pcVar15 = (char *)((ulong)uVar18 / 3);
      (*(code *)internal::s_print)
                ("Adding UV mesh %d: %u vertices, %u triangles\n",atlas[4].chartCount,uVar17);
    }
    uVar22 = (ulong)uVar18 % 3;
    if ((int)uVar22 == 0) {
      iVar9 = 0;
      if (local_50 == 0) {
LAB_00113f03:
        uVar17 = 0;
        local_54 = uVar18 / 3;
        meshInstance = (UvMeshInstance *)
                       internal::Realloc((void *)0x0,0x20,iVar9,pcVar15,(int)puVar20);
        (meshInstance->texcoords).m_base.buffer = (uint8_t *)0x0;
        (meshInstance->texcoords).m_base.elementSize = 0;
        (meshInstance->texcoords).m_base.size = 0;
        *(undefined8 *)&(meshInstance->texcoords).m_base.capacity = 0;
        (meshInstance->texcoords).m_base.elementSize = 8;
        (meshInstance->texcoords).m_base.capacity = 0;
        meshInstance->mesh = (UvMesh *)0x0;
        internal::ArrayBase::push_back((ArrayBase *)(atlas + 5),(uint8_t *)&meshInstance);
        mesh = (UvMesh *)0x0;
        puVar3 = &atlas[4].width;
        uVar16 = extraout_RDX_00;
        while( true ) {
          iVar19 = (int)puVar20;
          iVar9 = (int)uVar16;
          if (atlas[4].chartCount <= uVar17) break;
          ppUVar10 = internal::Array<xatlas::internal::UvMesh_*>::operator[]
                               ((Array<xatlas::internal::UvMesh_*> *)puVar3,uVar17);
          iVar9 = bcmp(*ppUVar10,decl,0x30);
          iVar19 = (int)puVar20;
          if (iVar9 == 0) {
            ppUVar10 = internal::Array<xatlas::internal::UvMesh_*>::operator[]
                                 ((Array<xatlas::internal::UvMesh_*> *)puVar3,uVar17);
            mesh = *ppUVar10;
            pcVar15 = internal::s_print;
            iVar9 = extraout_EDX;
            if ((internal::s_print != (undefined *)0x0) && (internal::s_printVerbose == '\x01')) {
              (*(code *)internal::s_print)();
              iVar9 = extraout_EDX_00;
            }
            break;
          }
          uVar17 = uVar17 + 1;
          uVar16 = extraout_RDX_01;
        }
        if (mesh == (UvMesh *)0x0) {
          i_00 = 0;
          this = (UvMesh *)internal::Realloc((void *)0x0,200,iVar9,pcVar15,iVar19);
          memset(this,0,200);
          internal::UvMesh::UvMesh(this);
          mesh = this;
          internal::ArrayBase::push_back((ArrayBase *)puVar3,(uint8_t *)&mesh);
          pvVar1 = decl->vertexUvData;
          pvVar2 = decl->indexData;
          puVar3 = decl->faceMaterialData;
          uVar6 = decl->vertexCount;
          uVar7 = decl->vertexStride;
          uVar8 = decl->indexCount;
          iVar4 = decl->indexOffset;
          IVar5 = decl->indexFormat;
          (mesh->decl).vertexStride = decl->vertexStride;
          (mesh->decl).indexCount = uVar8;
          (mesh->decl).indexOffset = iVar4;
          (mesh->decl).indexFormat = IVar5;
          (mesh->decl).faceMaterialData = puVar3;
          (mesh->decl).vertexCount = uVar6;
          (mesh->decl).vertexStride = uVar7;
          (mesh->decl).vertexUvData = pvVar1;
          (mesh->decl).indexData = pvVar2;
          if (decl->faceMaterialData != (uint32_t *)0x0) {
            internal::Array<unsigned_int>::resize(&mesh->faceMaterials,decl->indexCount / 3);
            memcpy((mesh->faceMaterials).m_base.buffer,decl->faceMaterialData,
                   (ulong)(mesh->faceMaterials).m_base.size << 2);
          }
          uVar17 = local_54;
          internal::Array<unsigned_int>::resize(&mesh->indices,decl->indexCount);
          for (; uVar18 != i_00; i_00 = i_00 + 1) {
            uVar8 = i_00;
            if (local_50 != 0) {
              uVar8 = DecodeIndex(decl->indexFormat,decl->indexData,decl->indexOffset,i_00);
            }
            puVar11 = internal::Array<unsigned_int>::operator[](&mesh->indices,i_00);
            *puVar11 = uVar8;
          }
          internal::Array<xatlas::internal::Vector2>::resize(&mesh->texcoords,decl->vertexCount);
          for (uVar18 = 0; uVar18 < decl->vertexCount; uVar18 = uVar18 + 1) {
            pvVar1 = decl->vertexUvData;
            uVar8 = decl->vertexStride;
            pVVar12 = internal::Array<xatlas::internal::Vector2>::operator[]
                                (&mesh->texcoords,uVar18);
            *pVVar12 = *(Vector2 *)((long)pvVar1 + (ulong)(uVar8 * uVar18));
          }
          internal::BitArray::resize(&mesh->faceIgnore,decl->indexCount / 3);
          internal::Array<unsigned_int>::zeroOutMemory(&(mesh->faceIgnore).m_wordArray);
          iVar9 = 0;
          uVar18 = 0;
          for (uVar22 = 0; uVar22 != uVar17; uVar22 = uVar22 + 1) {
            for (lVar23 = 0; lVar23 != 3; lVar23 = lVar23 + 1) {
              puVar11 = internal::Array<unsigned_int>::operator[]
                                  (&mesh->indices,(int)lVar23 + iVar9);
              tri[lVar23] = *puVar11;
            }
            lVar23 = 0;
            do {
              if (lVar23 == 3) {
                local_50 = tri[0];
                pVVar12 = internal::Array<xatlas::internal::Vector2>::operator[]
                                    (&mesh->texcoords,tri[0]);
                local_54 = tri[1];
                pVVar13 = internal::Array<xatlas::internal::Vector2>::operator[]
                                    (&mesh->texcoords,tri[1]);
                uVar8 = tri[2];
                pVVar14 = internal::Array<xatlas::internal::Vector2>::operator[]
                                    (&mesh->texcoords,tri[2]);
                fVar24 = ABS(((pVVar14->y - pVVar12->y) * (pVVar13->x - pVVar12->x) -
                             (pVVar13->y - pVVar12->y) * (pVVar14->x - pVVar12->x)) * 0.5);
                if (1.1920929e-07 < fVar24) goto LAB_001142cd;
                if ((internal::s_print != (undefined *)0x0 && uVar18 + 1 < 0x33) &&
                   (internal::s_printVerbose == '\x01')) {
                  (*(code *)internal::s_print)
                            (SUB84((double)fVar24,0),
                             "   Zero area face: %d, indices (%d %d %d), area is %f\n",
                             uVar22 & 0xffffffff,local_50,local_54,uVar8);
                }
                goto LAB_001142bc;
              }
              uVar8 = tri[lVar23];
              pVVar12 = internal::Array<xatlas::internal::Vector2>::operator[]
                                  (&mesh->texcoords,uVar8);
              if (NAN(pVVar12->x)) break;
              pVVar12 = internal::Array<xatlas::internal::Vector2>::operator[]
                                  (&mesh->texcoords,uVar8);
              lVar23 = lVar23 + 1;
            } while (!NAN(pVVar12->y));
            if ((internal::s_print != (undefined *)0x0 && uVar18 + 1 < 0x33) &&
               (internal::s_printVerbose == '\x01')) {
              (*(code *)internal::s_print)("   NAN texture coordinate in vertex %u\n",uVar8);
            }
LAB_001142bc:
            uVar18 = uVar18 + 1;
            internal::BitArray::set(&mesh->faceIgnore,(uint32_t)uVar22);
LAB_001142cd:
            iVar9 = iVar9 + 3;
          }
          if ((0x32 < uVar18 && internal::s_print != (undefined *)0x0) &&
             (internal::s_printVerbose == '\x01')) {
            (*(code *)internal::s_print)("   %u additional warnings truncated\n",uVar18 - 0x32);
          }
        }
        meshInstance->mesh = mesh;
        AVar21 = Success;
      }
      else {
        uVar17 = 0;
        AVar21 = IndexOutOfRange;
        do {
          iVar9 = (int)uVar22;
          if (uVar18 == uVar17) goto LAB_00113f03;
          pcVar15 = (char *)(ulong)uVar17;
          uVar8 = DecodeIndex(decl->indexFormat,decl->indexData,decl->indexOffset,uVar17);
          uVar17 = uVar17 + 1;
          uVar22 = extraout_RDX;
        } while (uVar8 < decl->vertexCount);
      }
    }
    else {
      AVar21 = InvalidIndexCount;
    }
  }
  else {
    AVar21 = Error;
    if (internal::s_print != (undefined *)0x0) {
      (*(code *)internal::s_print)
                ("AddUvMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
    }
  }
  return AVar21;
}

Assistant:

AddMeshError AddUvMesh(Atlas *atlas, const UvMeshDecl &decl)
{
	XA_DEBUG_ASSERT(atlas);
	if (!atlas) {
		XA_PRINT_WARNING("AddUvMesh: atlas is null.\n");
		return AddMeshError::Error;
	}
	Context *ctx = (Context *)atlas;
	if (!ctx->meshes.isEmpty()) {
		XA_PRINT_WARNING("AddUvMesh: Meshes and UV meshes cannot be added to the same atlas.\n");
		return AddMeshError::Error;
	}
#if XA_PROFILE
	if (ctx->uvMeshInstances.isEmpty())
		internal::s_profile.addMeshRealStart = std::chrono::high_resolution_clock::now();
#endif
	XA_PROFILE_START(addMeshCopyData)
	const bool hasIndices = decl.indexCount > 0;
	const uint32_t indexCount = hasIndices ? decl.indexCount : decl.vertexCount;
	XA_PRINT("Adding UV mesh %d: %u vertices, %u triangles\n", ctx->uvMeshes.size(), decl.vertexCount, indexCount / 3);
	// Expecting triangle faces.
	if ((indexCount % 3) != 0)
		return AddMeshError::InvalidIndexCount;
	if (hasIndices) {
		// Check if any index is out of range.
		for (uint32_t i = 0; i < indexCount; i++) {
			const uint32_t index = DecodeIndex(decl.indexFormat, decl.indexData, decl.indexOffset, i);
			if (index >= decl.vertexCount)
				return AddMeshError::IndexOutOfRange;
		}
	}
	// Create a mesh instance.
	internal::UvMeshInstance *meshInstance = XA_NEW(internal::MemTag::Default, internal::UvMeshInstance);
	meshInstance->mesh = nullptr;
	ctx->uvMeshInstances.push_back(meshInstance);
	// See if this is an instance of an already existing mesh.
	internal::UvMesh *mesh = nullptr;
	for (uint32_t m = 0; m < ctx->uvMeshes.size(); m++) {
		if (memcmp(&ctx->uvMeshes[m]->decl, &decl, sizeof(UvMeshDecl)) == 0) {
			mesh = ctx->uvMeshes[m];
			XA_PRINT("   instance of a previous UV mesh\n");
			break;
		}
	}
	if (!mesh) {
		// Copy geometry to mesh.
		mesh = XA_NEW(internal::MemTag::Default, internal::UvMesh);
		ctx->uvMeshes.push_back(mesh);
		mesh->decl = decl;
		if (decl.faceMaterialData) {
			mesh->faceMaterials.resize(decl.indexCount / 3);
			memcpy(mesh->faceMaterials.data(), decl.faceMaterialData, mesh->faceMaterials.size() * sizeof(uint32_t));
		}
		mesh->indices.resize(decl.indexCount);
		for (uint32_t i = 0; i < indexCount; i++)
			mesh->indices[i] = hasIndices ? DecodeIndex(decl.indexFormat, decl.indexData, decl.indexOffset, i) : i;
		mesh->texcoords.resize(decl.vertexCount);
		for (uint32_t i = 0; i < decl.vertexCount; i++)
			mesh->texcoords[i] = *((const internal::Vector2 *)&((const uint8_t *)decl.vertexUvData)[decl.vertexStride * i]);
		// Validate.
		mesh->faceIgnore.resize(decl.indexCount / 3);
		mesh->faceIgnore.zeroOutMemory();
		const uint32_t kMaxWarnings = 50;
		uint32_t warningCount = 0;
		for (uint32_t f = 0; f < indexCount / 3; f++) {
			bool ignore = false;
			uint32_t tri[3];
			for (uint32_t i = 0; i < 3; i++)
				tri[i] = mesh->indices[f * 3 + i];
			// Check for nan UVs.
			for (uint32_t i = 0; i < 3; i++) {
				const uint32_t vertex = tri[i];
				if (internal::isNan(mesh->texcoords[vertex].x) || internal::isNan(mesh->texcoords[vertex].y)) {
					ignore = true;
					if (++warningCount <= kMaxWarnings)
						XA_PRINT("   NAN texture coordinate in vertex %u\n", vertex);
					break;
				}
			}
			// Check for zero area faces.
			if (!ignore) {
				const internal::Vector2 &v1 = mesh->texcoords[tri[0]];
				const internal::Vector2 &v2 = mesh->texcoords[tri[1]];
				const internal::Vector2 &v3 = mesh->texcoords[tri[2]];
				const float area = fabsf(((v2.x - v1.x) * (v3.y - v1.y) - (v3.x - v1.x) * (v2.y - v1.y)) * 0.5f);
				if (area <= internal::kAreaEpsilon) {
					ignore = true;
					if (++warningCount <= kMaxWarnings)
						XA_PRINT("   Zero area face: %d, indices (%d %d %d), area is %f\n", f, tri[0], tri[1], tri[2], area);
				}
			}
			if (ignore)
				mesh->faceIgnore.set(f);
		}
		if (warningCount > kMaxWarnings)
			XA_PRINT("   %u additional warnings truncated\n", warningCount - kMaxWarnings);
	}
	meshInstance->mesh = mesh;
	XA_PROFILE_END(addMeshCopyData)
	return AddMeshError::Success;
}